

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_ugm_session::tokenize
          (llm_tokenizer_ugm_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  pointer pbVar1;
  float *pfVar2;
  float fVar3;
  llama_token id;
  pointer piVar4;
  pointer piVar5;
  undefined4 uVar6;
  llm_tokenizer_ugm_session *plVar7;
  bool bVar8;
  size_t sVar9;
  naive_trie *this_00;
  undefined7 extraout_var;
  token_data *ptVar10;
  undefined4 *puVar11;
  ulong uVar12;
  size_type sVar13;
  long lVar14;
  pointer pbVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  tokenization_results;
  string normalized;
  allocator_type local_cd;
  undefined4 local_cc;
  vector<int,_std::allocator<int>_> *local_c8;
  ulong local_c0;
  llm_tokenizer_ugm_session *local_b8;
  float *local_b0;
  _Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  local_a8;
  long local_90;
  long local_88;
  size_t local_80;
  ulong local_78;
  token_data *local_70;
  string local_68;
  value_type local_48;
  
  piVar4 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar5 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_c8 = output;
  normalize(this,text,&local_68);
  sVar13 = local_68._M_string_length;
  if (local_68._M_string_length != 0) {
    local_48.token_id =
         *(llama_token *)
          ((long)(this->vocab->pimpl)._M_t.
                 super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                 .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
    local_48.input_offset = 0;
    local_48.score_sum = -3.4028235e+38;
    llama_vocab::std::
    vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
    ::vector((vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
              *)&local_a8,local_68._M_string_length + 1,&local_48,&local_cd);
    (local_a8._M_impl.super__Vector_impl_data._M_start)->token_id =
         *(llama_token *)
          ((long)(this->vocab->pimpl)._M_t.
                 super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                 .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
    *(undefined4 *)&(local_a8._M_impl.super__Vector_impl_data._M_start)->field_0x14 = 0;
    *(undefined8 *)&(local_a8._M_impl.super__Vector_impl_data._M_start)->field_0x4 = 0;
    *(undefined8 *)((long)&(local_a8._M_impl.super__Vector_impl_data._M_start)->input_offset + 4) =
         0;
    local_78 = sVar13;
    uVar16 = 0;
    local_b8 = this;
    local_90 = (long)piVar4 - (long)piVar5;
    while (plVar7 = local_b8, uVar12 = sVar13 - uVar16, uVar16 <= sVar13 && uVar12 != 0) {
      sVar9 = unicode_len_utf8(local_68._M_dataplus._M_p[uVar16]);
      pbVar15 = local_a8._M_impl.super__Vector_impl_data._M_start;
      if (uVar12 < sVar9) {
        sVar9 = uVar12;
      }
      this_00 = naive_trie::traverse
                          (&plVar7->tokenizer->token_matcher,local_68._M_dataplus._M_p[uVar16]);
      local_88 = uVar16 * 0x18;
      local_b0 = &pbVar15[uVar16].score_sum;
      lVar14 = local_88 + 0x28;
      uVar12 = 0;
      local_c0 = uVar16;
      local_80 = sVar9;
      while( true ) {
        plVar7 = local_b8;
        sVar9 = sVar9 - 1;
        uVar16 = uVar16 + 1;
        if ((this_00 == (naive_trie *)0x0) || (sVar13 < uVar16)) break;
        if (this_00->has_value == true) {
          id = this_00->value;
          local_cc = (int)uVar12;
          local_70 = llama_vocab::get_token_data(local_b8->vocab,id);
          bVar8 = llama_vocab::is_user_defined(plVar7->vocab,id);
          fVar18 = 0.0;
          ptVar10 = (token_data *)CONCAT71(extraout_var,bVar8);
          if (!bVar8) {
            fVar18 = local_70->score;
            ptVar10 = local_70;
          }
          uVar12 = CONCAT71((int7)((ulong)ptVar10 >> 8),sVar9 == 0 | (byte)local_cc) & 0xffffffff;
          fVar3 = *local_b0;
          sVar13 = local_78;
          if (*(float *)((long)&(local_a8._M_impl.super__Vector_impl_data._M_start)->token_id +
                        lVar14) < fVar3 + fVar18) {
            *(llama_token *)
             ((long)local_a8._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x10) = id;
            *(ulong *)((long)local_a8._M_impl.super__Vector_impl_data._M_start + lVar14 + -8) =
                 local_c0;
            *(float *)((long)&(local_a8._M_impl.super__Vector_impl_data._M_start)->token_id + lVar14
                      ) = fVar3 + fVar18;
          }
        }
        lVar14 = lVar14 + 0x18;
        this_00 = naive_trie::traverse(this_00,local_68._M_dataplus._M_p[uVar16]);
      }
      if ((uVar12 & 1) == 0) {
        fVar18 = *local_b0 + local_b8->tokenizer->unknown_token_score;
        pfVar2 = (float *)((long)&local_a8._M_impl.super__Vector_impl_data._M_start[local_80].
                                  score_sum + local_88);
        if (*pfVar2 <= fVar18 && fVar18 != *pfVar2) {
          puVar11 = (undefined4 *)
                    ((long)&local_a8._M_impl.super__Vector_impl_data._M_start[local_80].token_id +
                    local_88);
          *puVar11 = *(undefined4 *)
                      ((long)(local_b8->vocab->pimpl)._M_t.
                             super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                             .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
          *(ulong *)(puVar11 + 2) = local_c0;
          puVar11[4] = fVar18;
        }
      }
      uVar16 = local_c0 + local_80;
    }
    pbVar15 = local_a8._M_impl.super__Vector_impl_data._M_start + sVar13;
    bVar8 = false;
    while( true ) {
      bVar17 = pbVar15->token_id ==
               *(int *)((long)(plVar7->vocab->pimpl)._M_t.
                              super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                              .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
      if (!(bool)(bVar8 & bVar17)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_c8,&pbVar15->token_id);
      }
      sVar9 = pbVar15->input_offset;
      if (sVar9 == 0) break;
      uVar6 = *(undefined4 *)&local_a8._M_impl.super__Vector_impl_data._M_start[sVar9].field_0x14;
      pbVar15->score_sum = local_a8._M_impl.super__Vector_impl_data._M_start[sVar9].score_sum;
      *(undefined4 *)&pbVar15->field_0x14 = uVar6;
      pbVar1 = local_a8._M_impl.super__Vector_impl_data._M_start + sVar9;
      uVar6 = *(undefined4 *)&pbVar1->field_0x4;
      sVar9 = pbVar1->input_offset;
      pbVar15->token_id = pbVar1->token_id;
      *(undefined4 *)&pbVar15->field_0x4 = uVar6;
      pbVar15->input_offset = sVar9;
      bVar8 = bVar17;
    }
    std::__reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_90 +
               (long)(local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
               (local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    llama_vocab::std::
    _Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
    ::~_Vector_base(&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        // get current size of output (for reversal later)
        size_t output_size = output.size();

        // normalize the input first
        std::string normalized;
        normalize(text, &normalized);
        size_t input_len = normalized.size();
        if (input_len == 0) {
            return;
        }

        // initialize score_sum to -FLT_MAX so it will be always lower than sums of token scores
        std::vector<struct best_tokenization> tokenization_results(input_len + 1, {vocab.token_unk(), 0, -FLT_MAX});
        // at the beginning tokenization score is zero
        tokenization_results[0] = { vocab.token_unk(), 0, 0 };

        for (size_t input_offset = 0; input_offset < input_len;) {
            size_t prefix_offset = input_offset;
            // calculate how many code units are in the currently processed UTF code point
            size_t n_utf8_code_units = std::min<size_t>(unicode_len_utf8(normalized[input_offset]), input_len - input_offset);

            // traverse the token matcher trie to find a matching token
            bool single_codepoint_token_found = false;
            const struct best_tokenization & current_best = tokenization_results[input_offset];
            const struct naive_trie * node = tokenizer.token_matcher.traverse(normalized[prefix_offset++]);

            while (prefix_offset <= input_len && node != NULL) {
                // check if we found valid token in prefix
                if (node->has_value) {
                    // check if it corresponds to the whole UTF code point
                    if (prefix_offset - input_offset == n_utf8_code_units) {
                        single_codepoint_token_found = true;
                    }
                    llama_token token_id = node->value;
                    const auto & token_data = vocab.get_token_data(token_id);

                    // we set the user-defined token scores to 0 to make them more likely to be selected
                    // (normal token scores are log probabilities, so they are negative)
                    // score type is double here to make tokenization results exactly
                    // the same as in the HF tokenizer using SentencePiece
                    const double token_score = vocab.is_user_defined(token_id) ? 0.0 : token_data.score;
                    const double challenger_score = current_best.score_sum + token_score;
                    struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                    if (challenger_score > current_champ.score_sum) {
                        struct best_tokenization challenger = { token_id, input_offset, (float) challenger_score };
                        current_champ = challenger;
                    }
                }
                node = node->traverse(normalized[prefix_offset++]);
            }

            // if we didn't find a valid token corresponding to the whole UTF code point
            // then use unknown token as the tokenization of this UTF code point
            if (!single_codepoint_token_found) {
                const double challenger_score = current_best.score_sum + tokenizer.unknown_token_score;
                prefix_offset = input_offset + n_utf8_code_units;
                struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                if (challenger_score > current_champ.score_sum) {
                    struct best_tokenization challenger = { vocab.token_unk(), input_offset, (float) challenger_score };
                    current_champ = challenger;
                }
            }

            // move to the next UTF code point
            input_offset += n_utf8_code_units;
        }

        // now backtrack from the end to gather token ids of the best tokenization
        // merge sequences of consecutive unknown tokens into single unknown tokens
        bool is_prev_unknown = false;
        for (struct best_tokenization & tokenization = tokenization_results[input_len]; ; tokenization = tokenization_results[tokenization.input_offset]) {
            bool is_unknown = tokenization.token_id == vocab.token_unk();
            if (!(is_prev_unknown && is_unknown)) {
                output.push_back(tokenization.token_id);
            }
            if (tokenization.input_offset == 0) {
                break;
            }
            is_prev_unknown = is_unknown;
        }

        // reverse the output since we added tokens starting from the end of the input
        std::reverse(output.begin() + output_size, output.end());
    }